

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O2

int EncodeData(BrotliEncoderState *s,int is_last,int force_flush,size_t *out_size,uint8_t **output)

{
  BrotliHasherParams *pBVar1;
  MemoryManager *m;
  Hasher *hasher;
  size_t *last_insert_len;
  size_t *num_literals;
  int *piVar2;
  uint8_t uVar3;
  uint8_t uVar4;
  byte bVar5;
  byte bVar6;
  ushort uVar7;
  uint uVar8;
  uint64_t uVar9;
  uint8_t *data;
  uint16_t *puVar10;
  HasherCommon *pHVar11;
  void *pvVar12;
  BlockSplitFromDecoder *literals_block_splits_decoder;
  undefined3 uVar13;
  undefined8 uVar14;
  BrotliEncoderParams *pBVar15;
  ushort uVar16;
  int iVar17;
  uint uVar18;
  uint32_t uVar19;
  ContextType CVar20;
  int iVar21;
  ulong mask;
  uint32_t *puVar22;
  uint8_t *puVar23;
  int *piVar24;
  ulong uVar25;
  Command *pCVar26;
  uint8_t *puVar27;
  undefined4 extraout_var;
  long lVar28;
  uint *puVar29;
  uint *puVar30;
  bool bVar31;
  byte bVar32;
  char cVar33;
  uint uVar34;
  uint64_t uVar35;
  long lVar36;
  uint16_t uVar37;
  int iVar38;
  size_t sVar39;
  uint32_t *puVar40;
  long lVar41;
  uint32_t *puVar42;
  size_t sVar43;
  uint8_t *puVar44;
  uint uVar45;
  uint uVar46;
  ContextLut literal_context_lut;
  uint8_t uVar47;
  ulong uVar48;
  uint uVar49;
  int iVar50;
  ulong uVar51;
  uint32_t *buckets_2;
  size_t *psVar52;
  uint uVar53;
  uint8_t *puVar54;
  undefined1 *static_context_map;
  ulong uVar55;
  ulong uVar56;
  bool bVar57;
  bool bVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  double dVar68;
  double local_9a8;
  double local_9a0;
  size_t storage_ix_1;
  uint local_98c;
  double local_988;
  undefined8 uStack_980;
  size_t *local_978;
  int *local_970;
  double local_968;
  double dStack_960;
  double local_958;
  undefined8 uStack_950;
  long local_948;
  uint64_t local_940;
  BlockSplitFromDecoder *local_938;
  int *local_930;
  double local_928;
  undefined8 uStack_920;
  double local_918;
  undefined8 uStack_910;
  ulong local_908;
  uint8_t *local_900;
  uint32_t monogram_histo [3];
  uint local_8ec;
  int *local_8e8;
  ulong local_8e0;
  size_t *local_8d8;
  int local_8cc;
  size_t end_pos;
  uint8_t **local_8c0;
  size_t *local_8b8;
  ulong local_8b0;
  uint32_t combined_histo [32];
  size_t table_size;
  BlockSplit local_7f8;
  BlockSplit local_7c8;
  uint32_t *local_798;
  size_t sStack_790;
  uint32_t *local_788;
  size_t sStack_780;
  HistogramLiteral *local_778;
  size_t sStack_770;
  HistogramCommand *local_768;
  size_t sStack_760;
  HistogramDistance *local_758;
  size_t sStack_750;
  BrotliEncoderParams block_params;
  size_t storage_ix;
  undefined8 uStack_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined4 local_698;
  
  uVar9 = s->input_pos_;
  uVar35 = s->last_processed_pos_;
  local_8c0 = output;
  uVar18 = WrapPosition(uVar35);
  if (s->is_last_block_emitted_ != 0) {
    return 0;
  }
  uVar48 = uVar9 - uVar35;
  if (is_last != 0) {
    s->is_last_block_emitted_ = 1;
  }
  if ((ulong)(1L << ((byte)(s->params).lgblock & 0x3f)) < uVar48) {
    return 0;
  }
  local_900 = (uint8_t *)CONCAT44(local_900._4_4_,force_flush);
  local_928 = 4.94065645841247e-324;
  uVar8 = (s->ringbuffer_).mask_;
  mask = (ulong)uVar8;
  m = &s->memory_manager_;
  data = (s->ringbuffer_).buffer_;
  uVar45 = (s->params).quality;
  uVar49 = (uint)uVar48;
  local_978 = out_size;
  local_970 = (int *)uVar9;
  if (uVar45 == 1) {
    if (s->command_buf_ != (uint32_t *)0x0) goto LAB_0012b01d;
    puVar22 = (uint32_t *)BrotliAllocate(m,0x80000);
    s->command_buf_ = puVar22;
    puVar23 = (uint8_t *)BrotliAllocate(m,0x20000);
    s->literal_buf_ = puVar23;
    uVar45 = (s->params).quality;
  }
  if (uVar45 < 2) {
LAB_0012b01d:
    storage_ix = (size_t)s->last_bytes_bits_;
    if (is_last == 0 && local_970 == (int *)uVar35) {
      sVar39 = 0;
    }
    else {
      puVar23 = GetBrotliStorage(s,(ulong)(uVar49 * 2 + 0x1f7));
      *puVar23 = (uint8_t)s->last_bytes_;
      puVar23[1] = *(uint8_t *)((long)&s->last_bytes_ + 1);
      uVar48 = uVar48 & 0xffffffff;
      piVar24 = GetHashTable(s,(s->params).quality,uVar48,&table_size);
      psVar52 = local_978;
      if ((s->params).quality == 0) {
        BrotliCompressFragmentFast
                  (m,data + (uVar8 & uVar18),uVar48,is_last,piVar24,table_size,s->cmd_depths_,
                   s->cmd_bits_,&s->cmd_code_numbits_,s->cmd_code_,&storage_ix,puVar23);
      }
      else {
        BrotliCompressFragmentTwoPass
                  (m,data + (uVar8 & uVar18),uVar48,is_last,s->command_buf_,s->literal_buf_,piVar24,
                   table_size,&storage_ix,puVar23);
        psVar52 = local_978;
      }
      sVar39 = storage_ix >> 3;
      s->last_bytes_ = (ushort)puVar23[sVar39];
      s->last_bytes_bits_ = (byte)storage_ix & 7;
      UpdateLastProcessedPos(s);
      *local_8c0 = puVar23;
      local_978 = psVar52;
    }
    *local_978 = sVar39;
    return 1;
  }
  uVar25 = s->num_commands_ + (uVar48 >> 1 & 0x7fffffff) + 1;
  if (s->cmd_alloc_size_ < uVar25) {
    sVar39 = (uVar48 >> 2 & 0x3fffffff) + uVar25 + 0x10;
    s->cmd_alloc_size_ = sVar39;
    if (sVar39 == 0) {
      pCVar26 = (Command *)0x0;
    }
    else {
      pCVar26 = (Command *)BrotliAllocate(m,sVar39 * 0x10);
    }
    if (s->commands_ != (Command *)0x0) {
      memcpy(pCVar26,s->commands_,s->num_commands_ << 4);
      BrotliFree(m,s->commands_);
    }
    s->commands_ = pCVar26;
  }
  hasher = &s->hasher_;
  puVar23 = (uint8_t *)(ulong)uVar18;
  puVar22 = (uint32_t *)(uVar48 & 0xffffffff);
  bVar31 = uVar18 == 0 && is_last != 0;
  uVar45 = (uint)bVar31;
  if ((s->hasher_).common.extra != (void *)0x0) {
    local_8e8 = &(s->hasher_).common.is_prepared_;
    if ((s->hasher_).common.is_prepared_ == 0) goto LAB_0012b758;
    goto LAB_0012b9a2;
  }
  pBVar1 = &(s->params).hasher;
  uVar46 = (s->params).quality;
  uVar53 = 10;
  if ((int)uVar46 < 10) {
    if (uVar46 == 4) {
      if ((s->params).size_hint < 0x100000) {
LAB_0012b2f5:
        pBVar1->type = uVar46;
      }
      else {
        pBVar1->type = 0x36;
        uVar46 = 0x36;
      }
    }
    else {
      if ((int)uVar46 < 5) goto LAB_0012b2f5;
      uVar34 = (s->params).lgwin;
      if ((int)uVar34 < 0x11) {
        bVar57 = uVar46 < 9;
        bVar58 = 6 < uVar46;
        uVar46 = 0x28;
        if (bVar58) {
          uVar46 = 0x2a - bVar57;
        }
        pBVar1->type = uVar46;
      }
      else if ((uVar34 < 0x13) || ((s->params).size_hint < 0x100000)) {
        uVar34 = 0x10;
        if (uVar46 < 9) {
          uVar34 = uVar53;
        }
        (s->params).hasher.type = 5;
        (s->params).hasher.block_bits = uVar46 - 1;
        (s->params).hasher.bucket_bits = 0xf - (uint)(uVar46 < 7);
        if (uVar46 < 7) {
          uVar34 = 4;
        }
        (s->params).hasher.num_last_distances_to_check = uVar34;
        uVar46 = 5;
      }
      else {
        (s->params).hasher.type = 6;
        (s->params).hasher.bucket_bits = 0xf;
        (s->params).hasher.block_bits = uVar46 - 1;
        (s->params).hasher.hash_len = 5;
        uVar34 = 0x10;
        if (uVar46 < 9) {
          uVar34 = uVar53;
        }
        if (uVar46 < 7) {
          uVar34 = 4;
        }
        (s->params).hasher.num_last_distances_to_check = uVar34;
        uVar46 = 6;
      }
    }
  }
  else {
    pBVar1->type = 10;
    uVar46 = uVar53;
  }
  iVar21 = (s->params).lgwin;
  puVar42 = (uint32_t *)0x0;
  puVar40 = (uint32_t *)0x0;
  if (iVar21 < 0x19) {
    switch(uVar46 - 2) {
    case 0:
    case 1:
      goto switchD_0012b31a_caseD_0;
    case 2:
      goto switchD_0012b31a_caseD_2;
    case 3:
    case 4:
      goto switchD_0012b31a_caseD_3;
    case 5:
    case 6:
    case 7:
      break;
    case 8:
      goto switchD_0012b31a_caseD_8;
    default:
      switch(uVar46) {
      case 0x23:
        goto switchD_0012b361_caseD_23;
      case 0x24:
      case 0x25:
      case 0x26:
      case 0x27:
        break;
      case 0x28:
      case 0x29:
        goto switchD_0012b31a_caseD_2;
      case 0x2a:
        goto switchD_0012b361_caseD_2a;
      default:
        if (uVar46 == 0x36) {
          sVar39 = 0x400000;
          goto LAB_0012b4b3;
        }
      }
    }
    goto switchD_0012b31a_caseD_5;
  }
  puVar40 = puVar42;
  switch(uVar46 - 2) {
  case 0:
switchD_0012b31a_caseD_0:
    sVar39 = 0x40000;
    break;
  case 1:
    pBVar1->type = 0x23;
switchD_0012b361_caseD_23:
    sVar39 = 0x4040000;
    break;
  case 2:
switchD_0012b31a_caseD_2:
    sVar39 = 0x80000;
    break;
  case 3:
switchD_0012b31a_caseD_3:
    bVar32 = (byte)(s->params).hasher.bucket_bits;
    sVar39 = ((4L << (bVar32 & 0x3f)) << ((byte)(s->params).hasher.block_bits & 0x3f)) +
             (2L << (bVar32 & 0x3f));
    goto LAB_0012b4aa;
  case 4:
    (s->params).hasher.type = 0x41;
    bVar32 = (byte)(s->params).hasher.bucket_bits;
    sVar39 = ((4L << (bVar32 & 0x3f)) << ((byte)(s->params).hasher.block_bits & 0x3f)) +
             (2L << (bVar32 & 0x3f)) + 0x4000000;
    goto LAB_0012b4aa;
  case 5:
  case 6:
  case 7:
    goto switchD_0012b31a_caseD_5;
  case 8:
switchD_0012b31a_caseD_8:
    puVar42 = (uint32_t *)(1L << ((byte)iVar21 & 0x3f));
    puVar40 = puVar22;
    if (puVar42 < puVar22) {
      puVar40 = puVar42;
    }
    if (uVar18 != 0 || is_last == 0) {
      puVar40 = puVar42;
    }
    sVar39 = (long)puVar40 * 8 + 0x80000;
LAB_0012b4aa:
    if (sVar39 != 0) break;
    puVar40 = (uint32_t *)0x0;
    goto switchD_0012b31a_caseD_5;
  default:
    switch(uVar46) {
    case 0x23:
      goto switchD_0012b361_caseD_23;
    case 0x24:
    case 0x25:
    case 0x26:
    case 0x27:
      break;
    case 0x28:
    case 0x29:
      goto switchD_0012b31a_caseD_2;
    case 0x2a:
switchD_0012b361_caseD_2a:
      sVar39 = 0x140000;
      goto LAB_0012b4b3;
    default:
      if (uVar46 == 0x36) {
        pBVar1->type = 0x37;
        sVar39 = 0x4400000;
        goto LAB_0012b4b3;
      }
    }
    goto switchD_0012b31a_caseD_5;
  }
LAB_0012b4b3:
  puVar40 = (uint32_t *)BrotliAllocate(m,sVar39);
switchD_0012b31a_caseD_5:
  (s->hasher_).common.extra = puVar40;
  iVar21 = pBVar1->bucket_bits;
  iVar38 = (s->params).hasher.block_bits;
  iVar50 = (s->params).hasher.hash_len;
  (s->hasher_).common.params.type = pBVar1->type;
  (s->hasher_).common.params.bucket_bits = iVar21;
  (s->hasher_).common.params.block_bits = iVar38;
  (s->hasher_).common.params.hash_len = iVar50;
  (s->hasher_).common.params.num_last_distances_to_check =
       (s->params).hasher.num_last_distances_to_check;
  iVar21 = (s->hasher_).common.params.type;
  if (iVar21 - 2U < 9) {
    switch(iVar21) {
    default:
switchD_0012b565_caseD_2:
      (s->hasher_).privat._H2.common = &hasher->common;
      goto LAB_0012b64e;
    case 5:
      (s->hasher_).privat._H5.common_ = &hasher->common;
      iVar21 = (s->hasher_).common.params.bucket_bits;
      sVar43 = 1L << ((byte)iVar21 & 0x3f);
      iVar38 = (s->hasher_).common.params.block_bits;
      (s->hasher_).privat._H5.hash_shift_ = 0x20 - iVar21;
      (s->hasher_).privat._H5.bucket_size_ = sVar43;
      sVar39 = 1L << ((byte)iVar38 & 0x3f);
      (s->hasher_).privat._H5.block_size_ = sVar39;
      (s->hasher_).privat._H5.block_mask_ = (int)sVar39 - 1;
      (s->hasher_).privat._H5.num_ = (uint16_t *)puVar40;
      (s->hasher_).privat._H5.buckets_ = (uint32_t *)((long)puVar40 + sVar43 * 2);
      *(int *)&(s->hasher_).privat._H35.hb.table = iVar38;
      (s->hasher_).privat._H5.num_last_distances_to_check_ =
           (s->hasher_).common.params.num_last_distances_to_check;
      break;
    case 6:
      InitializeH6(&hasher->common,&(s->hasher_).privat._H6,
                   (BrotliEncoderParams *)
                   ((long)&switchD_0012b565::switchdataD_00157000 +
                   (long)(int)(&switchD_0012b565::switchdataD_00157000)[iVar21 - 2U]));
      break;
    case 7:
    case 8:
    case 9:
      break;
    case 10:
      (s->hasher_).privat._H2.buckets_ = puVar40;
      (s->hasher_).privat._H40.common = (HasherCommon *)(puVar40 + 0x20000);
      uVar46 = -1 << ((byte)(s->params).lgwin & 0x1f);
      *(ulong *)&(s->hasher_).privat = (ulong)~uVar46;
      (s->hasher_).privat._H5.hash_shift_ = uVar46 + 1;
    }
  }
  else {
    switch(iVar21) {
    case 0x23:
switchD_0012b524_caseD_23:
      (s->hasher_).privat._H35.common = &hasher->common;
      (s->hasher_).privat._H35.extra = puVar40;
      puVar40 = (uint32_t *)(s->hasher_).common.dict_num_lookups;
      sVar39 = (s->hasher_).common.dict_num_matches;
      iVar21 = (s->hasher_).common.params.type;
      iVar38 = (s->hasher_).common.params.bucket_bits;
      iVar50 = (s->hasher_).common.params.block_bits;
      iVar17 = (s->hasher_).common.params.hash_len;
      uVar14 = *(undefined8 *)&(s->hasher_).common.params.num_last_distances_to_check;
      (s->hasher_).privat._H6.num_ = (uint16_t *)(hasher->common).extra;
      (s->hasher_).privat._H6.buckets_ = puVar40;
      (s->hasher_).privat._H35.hb_common.dict_num_matches = sVar39;
      *(int *)((long)&(s->hasher_).privat + 0x50) = iVar21;
      *(int *)((long)&(s->hasher_).privat + 0x54) = iVar38;
      *(int *)((long)&(s->hasher_).privat + 0x58) = iVar50;
      *(int *)((long)&(s->hasher_).privat + 0x5c) = iVar17;
      *(undefined8 *)&(s->hasher_).privat._H35.hb_common.params.num_last_distances_to_check = uVar14
      ;
      (s->hasher_).privat._H35.fresh = 1;
      (s->hasher_).privat._H35.params = &s->params;
      break;
    case 0x24:
    case 0x25:
    case 0x26:
    case 0x27:
      break;
    case 0x28:
    case 0x29:
      (s->hasher_).privat._H40.common = &hasher->common;
      (s->hasher_).privat._H40.extra = puVar40;
      iVar21 = (s->params).quality;
      puVar40 = (uint32_t *)(ulong)((iVar21 < 7) + 7 << ((char)iVar21 - 4U & 0x1f));
LAB_0012b64e:
      (s->hasher_).privat._H2.buckets_ = puVar40;
      break;
    case 0x2a:
      (s->hasher_).privat._H42.common = &hasher->common;
      (s->hasher_).privat._H42.extra = puVar40;
      iVar21 = (s->params).quality;
      *(ulong *)((long)&(s->hasher_).privat + 0x400) =
           (ulong)((iVar21 < 7) + 7 << ((char)iVar21 - 4U & 0x1f));
      break;
    default:
      if (iVar21 == 0x36) goto switchD_0012b565_caseD_2;
      if (iVar21 == 0x37) goto switchD_0012b524_caseD_23;
      if (iVar21 == 0x41) {
        (s->hasher_).privat._H65.common = &hasher->common;
        (s->hasher_).privat._H65.extra = puVar40;
        sVar39 = (s->hasher_).common.dict_num_lookups;
        pBVar15 = (BrotliEncoderParams *)(s->hasher_).common.dict_num_matches;
        iVar21 = (s->hasher_).common.params.type;
        iVar38 = (s->hasher_).common.params.bucket_bits;
        iVar50 = (s->hasher_).common.params.block_bits;
        iVar17 = (s->hasher_).common.params.hash_len;
        uVar14 = *(undefined8 *)&(s->hasher_).common.params.num_last_distances_to_check;
        (s->hasher_).privat._H35.common = (HasherCommon *)(hasher->common).extra;
        (s->hasher_).privat._H65.hb_common.dict_num_lookups = sVar39;
        (s->hasher_).privat._H35.params = pBVar15;
        *(int *)((long)&(s->hasher_).privat + 0x88) = iVar21;
        *(int *)((long)&(s->hasher_).privat + 0x8c) = iVar38;
        *(int *)((long)&(s->hasher_).privat + 0x90) = iVar50;
        *(int *)((long)&(s->hasher_).privat + 0x94) = iVar17;
        *(undefined8 *)&(s->hasher_).privat._H65.hb_common.params.num_last_distances_to_check =
             uVar14;
        (s->hasher_).privat._H65.fresh = 1;
        (s->hasher_).privat._H65.params = &s->params;
      }
    }
  }
  (s->hasher_).common.is_prepared_ = 0;
LAB_0012b758:
  local_8e8 = &(s->hasher_).common.is_prepared_;
  iVar21 = (s->hasher_).common.params.type;
  uVar46 = (uint)bVar31;
  switch(iVar21) {
  case 2:
    PrepareH2(&(s->hasher_).privat._H2,uVar46,(size_t)puVar22,data);
    break;
  case 3:
    PrepareH3(&(s->hasher_).privat._H3,uVar45,(size_t)puVar22,data);
    break;
  case 4:
    PrepareH4(&(s->hasher_).privat._H4,uVar45,(size_t)puVar22,data);
    break;
  case 5:
    PrepareH5(&(s->hasher_).privat._H5,uVar45,(size_t)puVar22,data);
    break;
  case 6:
    PrepareH6(&(s->hasher_).privat._H6,uVar45,(size_t)puVar22,data);
    break;
  case 7:
  case 8:
  case 9:
    break;
  case 10:
    uVar19 = (s->hasher_).privat._H5.hash_shift_;
    puVar40 = (s->hasher_).privat._H2.buckets_;
    for (lVar36 = 0; lVar36 != 0x20000; lVar36 = lVar36 + 1) {
      puVar40[lVar36] = uVar19;
    }
    break;
  default:
    switch(iVar21) {
    case 0x23:
      PrepareH35(&(s->hasher_).privat._H35,uVar45,(size_t)puVar22,data);
      break;
    case 0x24:
    case 0x25:
    case 0x26:
    case 0x27:
      break;
    case 0x28:
      PrepareH40(&(s->hasher_).privat._H40,uVar45,(size_t)puVar22,data);
      break;
    case 0x29:
      PrepareH41(&(s->hasher_).privat._H41,uVar45,(size_t)puVar22,data);
      break;
    case 0x2a:
      PrepareH42(&(s->hasher_).privat._H42,uVar45,(size_t)puVar22,data);
      break;
    default:
      if (iVar21 == 0x36) {
        PrepareH54(&(s->hasher_).privat._H54,uVar46,(size_t)puVar22,data);
      }
      else if (iVar21 == 0x37) {
        PrepareH55(&(s->hasher_).privat._H55,uVar46,(size_t)puVar22,data);
      }
      else if (iVar21 == 0x41) {
        PrepareH65(&(s->hasher_).privat._H65,uVar46,(size_t)puVar22,data);
      }
    }
  }
  if (uVar18 == 0) {
    (s->hasher_).common.dict_num_lookups = 0;
    (s->hasher_).common.dict_num_matches = 0;
  }
  *local_8e8 = 1;
LAB_0012b9a2:
  iVar21 = (s->hasher_).common.params.type;
  local_940 = uVar35;
  local_938 = (BlockSplitFromDecoder *)uVar48;
  switch(iVar21) {
  case 2:
    if (2 < uVar18 && 6 < uVar49) {
      puVar22 = (s->hasher_).privat._H2.buckets_;
      puVar22[(ulong)(*(long *)(data + (uVar18 - 3 & uVar8)) * -0x42e1ca5843000000) >> 0x30] =
           uVar18 - 3;
      puVar22[(ulong)(*(long *)(data + (uVar18 - 2 & uVar8)) * -0x42e1ca5843000000) >> 0x30] =
           uVar18 - 2;
      puVar22[(ulong)(*(long *)(data + (uVar18 - 1 & uVar8)) * -0x42e1ca5843000000) >> 0x30] =
           uVar18 - 1;
    }
    break;
  case 3:
    if (2 < uVar18 && 6 < uVar49) {
      uVar45 = uVar18 - 3;
      puVar22 = (s->hasher_).privat._H2.buckets_;
      uVar49 = 0xffff;
      puVar22[(uint)(ushort)((ulong)(*(long *)(data + (uVar45 & uVar8)) * -0x42e1ca5843000000) >>
                            0x30) + (uVar45 & 8) & 0xffff] = uVar45;
      uVar45 = uVar18 - 2;
      puVar22[(uint)(ushort)((ulong)(*(long *)(data + (uVar45 & uVar8)) * -0x42e1ca5843000000) >>
                            0x30) + (uVar45 & 8) & 0xffff] = uVar45;
      uVar45 = (uint)(ushort)((ulong)(*(long *)(data + (uVar18 - 1 & uVar8)) * -0x42e1ca5843000000)
                             >> 0x30);
      uVar46 = uVar18 - 1 & 8;
LAB_0012c770:
      puVar22[uVar45 + uVar46 & uVar49] = uVar18 - 1;
    }
    break;
  case 4:
    if (2 < uVar18 && 6 < uVar49) {
      uVar45 = uVar18 - 3;
      puVar22 = (s->hasher_).privat._H2.buckets_;
      uVar49 = 0x1ffff;
      puVar22[(uint)((ulong)(*(long *)(data + (uVar45 & uVar8)) * -0x42e1ca5843000000) >> 0x2f) +
              (uVar45 & 0x18) & 0x1ffff] = uVar45;
      uVar45 = uVar18 - 2;
      puVar22[(uint)((ulong)(*(long *)(data + (uVar45 & uVar8)) * -0x42e1ca5843000000) >> 0x2f) +
              (uVar45 & 0x18) & 0x1ffff] = uVar45;
      uVar45 = (uint)((ulong)(*(long *)(data + (uVar18 - 1 & uVar8)) * -0x42e1ca5843000000) >> 0x2f)
      ;
LAB_0012c76b:
      uVar46 = uVar18 - 1 & 0x18;
      goto LAB_0012c770;
    }
    break;
  case 5:
    if (2 < uVar18 && 2 < uVar49) {
      uVar45 = (uint)(*(int *)(data + (uVar18 - 3 & uVar8)) * 0x1e35a7bd) >>
               (*(byte *)((long)&(s->hasher_).privat + 0x10) & 0x1f);
      puVar10 = (s->hasher_).privat._H5.num_;
      uVar7 = puVar10[uVar45];
      puVar22 = (s->hasher_).privat._H5.buckets_;
      puVar22[(ulong)((s->hasher_).privat._H5.block_mask_ & (uint)uVar7) +
              (ulong)(uVar45 << (*(byte *)((long)&(s->hasher_).privat + 0x18) & 0x1f))] = uVar18 - 3
      ;
      puVar10[uVar45] = uVar7 + 1;
      uVar45 = (uint)(*(int *)(data + (uVar18 - 2 & uVar8)) * 0x1e35a7bd) >>
               (*(byte *)((long)&(s->hasher_).privat + 0x10) & 0x1f);
      uVar7 = puVar10[uVar45];
      puVar22[(ulong)((s->hasher_).privat._H5.block_mask_ & (uint)uVar7) +
              (ulong)(uVar45 << (*(byte *)((long)&(s->hasher_).privat + 0x18) & 0x1f))] = uVar18 - 2
      ;
      puVar10[uVar45] = uVar7 + 1;
      uVar45 = (uint)(*(int *)(data + (uVar18 - 1 & uVar8)) * 0x1e35a7bd) >>
               (*(byte *)((long)&(s->hasher_).privat + 0x10) & 0x1f);
      uVar7 = puVar10[uVar45];
      puVar22[(ulong)((s->hasher_).privat._H5.block_mask_ & (uint)uVar7) +
              (ulong)(uVar45 << (*(byte *)((long)&(s->hasher_).privat + 0x18) & 0x1f))] = uVar18 - 1
      ;
      puVar10[uVar45] = uVar7 + 1;
    }
    break;
  case 6:
    if (2 < uVar18 && 6 < uVar49) {
      uVar48 = (s->hasher_).privat._H6.hash_mask_;
      uVar25 = (*(ulong *)(data + (uVar18 - 3 & uVar8)) & uVar48) * 0x1fe35a7bd3579bd3 >>
               (*(byte *)((long)&(s->hasher_).privat + 0x10) & 0x3f);
      puVar10 = (s->hasher_).privat._H6.num_;
      puVar22 = (s->hasher_).privat._H6.buckets_;
      uVar56 = uVar25 & 0xffffffff;
      uVar7 = puVar10[uVar56];
      uVar45 = (s->hasher_).privat._H6.block_mask_;
      bVar32 = *(byte *)((long)&(s->hasher_).privat + 0x24);
      puVar10[uVar56] = uVar7 + 1;
      puVar22[(ulong)(uVar45 & uVar7) + (ulong)(uint)((int)uVar25 << (bVar32 & 0x1f))] = uVar18 - 3;
      bVar32 = *(byte *)((long)&(s->hasher_).privat + 0x24);
      uVar25 = (*(ulong *)(data + (uVar18 - 2 & uVar8)) & uVar48) * 0x1fe35a7bd3579bd3 >>
               (*(byte *)((long)&(s->hasher_).privat + 0x10) & 0x3f);
      uVar56 = uVar25 & 0xffffffff;
      uVar7 = puVar10[uVar56];
      uVar45 = (s->hasher_).privat._H6.block_mask_;
      puVar10[uVar56] = uVar7 + 1;
      puVar22[(ulong)(uVar45 & uVar7) + (ulong)(uint)((int)uVar25 << (bVar32 & 0x1f))] = uVar18 - 2;
      bVar32 = *(byte *)((long)&(s->hasher_).privat + 0x24);
      uVar25 = (uVar48 & *(ulong *)(data + (uVar18 - 1 & uVar8))) * 0x1fe35a7bd3579bd3 >>
               (*(byte *)((long)&(s->hasher_).privat + 0x10) & 0x3f);
      uVar48 = uVar25 & 0xffffffff;
      uVar7 = puVar10[uVar48];
      uVar45 = (s->hasher_).privat._H6.block_mask_;
      puVar10[uVar48] = uVar7 + 1;
      puVar22[(ulong)(uVar45 & uVar7) + (ulong)(uint)((int)uVar25 << (bVar32 & 0x1f))] = uVar18 - 1;
    }
    break;
  case 7:
  case 8:
  case 9:
    break;
  case 10:
    if (0x7f < uVar18 && 2 < uVar49) {
      puVar54 = puVar23 + -0x7f;
      puVar27 = (uint8_t *)((long)puVar22 + (long)(puVar23 + -0x7f));
      if (puVar23 < (uint8_t *)((long)puVar22 + (long)(puVar23 + -0x7f))) {
        puVar27 = puVar23;
      }
      for (; puVar54 < puVar27; puVar54 = puVar54 + 1) {
        local_930 = (int *)(s->hasher_).privat._H5.bucket_size_;
        puVar22 = (s->hasher_).privat._H2.buckets_;
        local_8e0 = (long)puVar23 - (long)puVar54;
        if ((ulong)((long)puVar23 - (long)puVar54) < 0x10) {
          local_8e0 = 0xf;
        }
        local_8e0 = (long)local_930 - local_8e0;
        uVar48 = (ulong)((uint)puVar54 & uVar8);
        pHVar11 = (s->hasher_).privat._H40.common;
        uVar49 = (uint)(*(int *)(data + uVar48) * 0x1e35a7bd) >> 0xf;
        uVar45 = puVar22[uVar49];
        local_958 = (double)(((ulong)local_930 & (ulong)puVar54) * 2 + 1);
        local_9a0 = (double)(((ulong)local_930 & (ulong)puVar54) * 2);
        puVar22[uVar49] = (uint)puVar54;
        local_988 = 0.0;
        lVar36 = 0x40;
        dVar59 = 0.0;
        while (puVar54 != (uint8_t *)(ulong)uVar45) {
          bVar31 = lVar36 == 0;
          lVar36 = lVar36 + -1;
          if ((local_8e0 < (ulong)((long)puVar54 - (long)(ulong)uVar45)) || (bVar31)) break;
          dVar68 = local_988;
          if ((ulong)dVar59 < (ulong)local_988) {
            dVar68 = dVar59;
          }
          lVar28 = (long)dVar68 + (ulong)(uVar45 & uVar8);
          uVar25 = 0x80 - (long)dVar68;
          uVar56 = uVar25 & 0xfffffffffffffff8;
          uVar55 = 0;
          lVar41 = 0;
LAB_0012c019:
          if (uVar25 >> 3 == uVar55) {
            uVar51 = (ulong)((uint)uVar25 & 7);
            puVar44 = data + (lVar28 - lVar41);
            for (; (bVar31 = uVar51 != 0, uVar51 = uVar51 - 1, uVar55 = uVar25, bVar31 &&
                   (uVar55 = uVar56, data[uVar56 + (long)dVar68 + uVar48] == *puVar44));
                uVar56 = uVar56 + 1) {
              puVar44 = puVar44 + 1;
            }
          }
          else {
            if (*(ulong *)(data + uVar55 * 8 + lVar28) ==
                *(ulong *)(data + uVar55 * 8 + (long)dVar68 + uVar48)) goto code_r0x0012c03b;
            uVar56 = *(ulong *)(data + uVar55 * 8 + (long)dVar68 + uVar48) ^
                     *(ulong *)(data + uVar55 * 8 + lVar28);
            uVar25 = 0;
            if (uVar56 != 0) {
              for (; (uVar56 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
              }
            }
            uVar55 = (uVar25 >> 3 & 0x1fffffff) - lVar41;
          }
          dVar68 = (double)(uVar55 + (long)dVar68);
          local_968 = (double)lVar36;
          local_918 = dVar59;
          if (0x7f < (ulong)dVar68) {
            *(undefined4 *)((long)&pHVar11->extra + (long)local_9a0 * 4) =
                 *(undefined4 *)(&pHVar11->extra + ((uint)local_930 & uVar45));
            iVar21 = *(int *)((long)&pHVar11->extra + (ulong)((uint)local_930 & uVar45) * 8 + 4);
            goto LAB_0012c143;
          }
          dVar60 = (double)((ulong)(uVar45 & (uint)local_930) * 2);
          if (data[(long)dVar68 + (ulong)(uVar45 & uVar8)] < data[(long)dVar68 + uVar48]) {
            *(uint *)((long)&pHVar11->extra + (long)local_9a0 * 4) = uVar45;
            dVar60 = (double)((ulong)dVar60 | 1);
            dVar59 = dVar68;
            local_9a0 = dVar60;
          }
          else {
            *(uint *)((long)&pHVar11->extra + (long)local_958 * 4) = uVar45;
            local_988 = dVar68;
            local_958 = dVar60;
          }
          uVar45 = *(uint *)((long)&pHVar11->extra + (long)dVar60 * 4);
        }
        iVar21 = (s->hasher_).privat._H5.hash_shift_;
        *(int *)((long)&pHVar11->extra + (long)local_9a0 * 4) = iVar21;
LAB_0012c143:
        *(int *)((long)&pHVar11->extra + (long)local_958 * 4) = iVar21;
      }
    }
    break;
  default:
    switch(iVar21) {
    case 0x23:
      puVar40 = (uint32_t *)CONCAT71(0x1570,uVar49 < 7);
      if (2 < uVar18 && uVar49 >= 7) {
        uVar45 = uVar18 - 3;
        puVar40 = (s->hasher_).privat._H2.buckets_;
        uVar49 = 0xffff;
        puVar40[(uint)(ushort)((ulong)(*(long *)(data + (uVar45 & uVar8)) * -0x42e1ca5843000000) >>
                              0x30) + (uVar45 & 8) & 0xffff] = uVar45;
        uVar45 = uVar18 - 2;
        puVar40[(uint)(ushort)((ulong)(*(long *)(data + (uVar45 & uVar8)) * -0x42e1ca5843000000) >>
                              0x30) + (uVar45 & 8) & 0xffff] = uVar45;
        uVar45 = (uint)(ushort)((ulong)(*(long *)(data + (uVar18 - 1 & uVar8)) * -0x42e1ca5843000000
                                       ) >> 0x30);
        uVar46 = uVar18 - 1 & 8;
LAB_0012c69a:
        puVar40[uVar45 + uVar46 & uVar49] = uVar18 - 1;
      }
LAB_0012c6a1:
      if ((uVar18 & 3) != 0) {
        puVar40 = (uint32_t *)(4 - ((ulong)puVar23 & 3));
        bVar31 = puVar22 < puVar40;
        puVar22 = (uint32_t *)((long)puVar22 - (long)puVar40);
        if (bVar31) {
          puVar22 = (uint32_t *)0x0;
        }
        puVar23 = puVar23 + (long)puVar40;
      }
      uVar48 = (ulong)((uint)puVar23 & uVar8);
      puVar42 = (uint32_t *)(mask - uVar48);
      if (puVar22 < puVar42) {
        puVar42 = puVar22;
      }
      PrepareHROLLING_FAST
                (&(s->hasher_).privat._H35.hb,(int)puVar42,(size_t)(data + uVar48),
                 (uint8_t *)puVar40);
      *(uint8_t **)&(s->hasher_).privat._H65.ha.block_mask_ = puVar23;
      break;
    case 0x24:
    case 0x25:
    case 0x26:
    case 0x27:
      break;
    case 0x28:
    case 0x29:
      if (2 < uVar18 && 2 < uVar49) {
        puVar54 = puVar23 + -3;
        pvVar12 = (s->hasher_).privat._H40.extra;
        uVar45 = (uint)(*(int *)(data + ((uint)puVar54 & uVar8)) * 0x1e35a7bd) >> 0x11;
        uVar48 = (ulong)uVar45;
        uVar7 = (s->hasher_).privat._H42.free_slot_idx[0];
        (s->hasher_).privat._H42.free_slot_idx[0] = uVar7 + 1;
        uVar25 = (long)puVar54 - (ulong)*(uint *)((long)pvVar12 + uVar48 * 4);
        *(char *)((long)pvVar12 + ((ulong)puVar54 & 0xffff) + 0x30000) = (char)uVar45;
        if (0xfffe < uVar25) {
          uVar25 = 0xffff;
        }
        *(short *)((long)pvVar12 + (ulong)uVar7 * 4 + 0x40000) = (short)uVar25;
        *(undefined2 *)((long)pvVar12 + (ulong)uVar7 * 4 + 0x40002) =
             *(undefined2 *)((long)pvVar12 + uVar48 * 2 + 0x20000);
        *(uint *)((long)pvVar12 + uVar48 * 4) = (uint)puVar54;
        *(ushort *)((long)pvVar12 + uVar48 * 2 + 0x20000) = uVar7;
        puVar54 = puVar23 + -2;
        pvVar12 = (s->hasher_).privat._H40.extra;
        uVar45 = (uint)(*(int *)(data + ((uint)puVar54 & uVar8)) * 0x1e35a7bd) >> 0x11;
        uVar48 = (ulong)uVar45;
        uVar7 = (s->hasher_).privat._H42.free_slot_idx[0];
        (s->hasher_).privat._H42.free_slot_idx[0] = uVar7 + 1;
        uVar25 = (long)puVar54 - (ulong)*(uint *)((long)pvVar12 + uVar48 * 4);
        *(char *)((long)pvVar12 + ((ulong)puVar54 & 0xffff) + 0x30000) = (char)uVar45;
        if (0xfffe < uVar25) {
          uVar25 = 0xffff;
        }
        *(short *)((long)pvVar12 + (ulong)uVar7 * 4 + 0x40000) = (short)uVar25;
        *(undefined2 *)((long)pvVar12 + (ulong)uVar7 * 4 + 0x40002) =
             *(undefined2 *)((long)pvVar12 + uVar48 * 2 + 0x20000);
        *(uint *)((long)pvVar12 + uVar48 * 4) = (uint)puVar54;
        *(ushort *)((long)pvVar12 + uVar48 * 2 + 0x20000) = uVar7;
        puVar23 = puVar23 + -1;
        pvVar12 = (s->hasher_).privat._H40.extra;
        uVar45 = (uint)(*(int *)(data + ((uint)puVar23 & uVar8)) * 0x1e35a7bd) >> 0x11;
        uVar48 = (ulong)uVar45;
        uVar7 = (s->hasher_).privat._H42.free_slot_idx[0];
        (s->hasher_).privat._H42.free_slot_idx[0] = uVar7 + 1;
        uVar25 = (long)puVar23 - (ulong)*(uint *)((long)pvVar12 + uVar48 * 4);
        *(char *)((long)pvVar12 + ((ulong)puVar23 & 0xffff) + 0x30000) = (char)uVar45;
        if (0xfffe < uVar25) {
          uVar25 = 0xffff;
        }
        *(short *)((long)pvVar12 + (ulong)uVar7 * 4 + 0x40000) = (short)uVar25;
        *(undefined2 *)((long)pvVar12 + (ulong)uVar7 * 4 + 0x40002) =
             *(undefined2 *)((long)pvVar12 + uVar48 * 2 + 0x20000);
        *(uint *)((long)pvVar12 + uVar48 * 4) = (uint)puVar23;
        *(ushort *)((long)pvVar12 + uVar48 * 2 + 0x20000) = uVar7;
      }
      break;
    case 0x2a:
      if (2 < uVar18 && 2 < uVar49) {
        puVar54 = puVar23 + -3;
        pvVar12 = (s->hasher_).privat._H42.extra;
        uVar49 = (uint)(*(int *)(data + ((uint)puVar54 & uVar8)) * 0x1e35a7bd) >> 0x11;
        uVar48 = (ulong)uVar49;
        uVar45 = uVar49 & 0x1ff;
        uVar7 = *(ushort *)((long)s->saved_dist_cache_ + (ulong)uVar45 * 2 + 0x58);
        *(ushort *)((long)s->saved_dist_cache_ + (ulong)uVar45 * 2 + 0x58) = uVar7 + 1;
        uVar25 = (ulong)uVar7 & 0x1ff;
        uVar56 = (long)puVar54 - (ulong)*(uint *)((long)pvVar12 + uVar48 * 4);
        if (0xfffe < uVar56) {
          uVar56 = 0xffff;
        }
        *(char *)((long)pvVar12 + ((ulong)puVar54 & 0xffff) + 0x30000) = (char)uVar49;
        *(short *)((long)pvVar12 + uVar25 * 4 + (ulong)(uVar45 << 0xb) + 0x40000) = (short)uVar56;
        *(undefined2 *)((long)pvVar12 + uVar25 * 4 + (ulong)(uVar45 << 0xb) + 0x40002) =
             *(undefined2 *)((long)pvVar12 + uVar48 * 2 + 0x20000);
        *(uint *)((long)pvVar12 + uVar48 * 4) = (uint)puVar54;
        *(short *)((long)pvVar12 + uVar48 * 2 + 0x20000) = (short)uVar25;
        puVar54 = puVar23 + -2;
        pvVar12 = (s->hasher_).privat._H42.extra;
        uVar45 = (uint)(*(int *)(data + ((uint)puVar54 & uVar8)) * 0x1e35a7bd) >> 0x11;
        uVar25 = (ulong)uVar45;
        uVar49 = uVar45 & 0x1ff;
        uVar7 = *(ushort *)((long)s->saved_dist_cache_ + (ulong)uVar49 * 2 + 0x58);
        *(ushort *)((long)s->saved_dist_cache_ + (ulong)uVar49 * 2 + 0x58) = uVar7 + 1;
        uVar56 = (ulong)uVar7 & 0x1ff;
        uVar48 = (long)puVar54 - (ulong)*(uint *)((long)pvVar12 + uVar25 * 4);
        *(char *)((long)pvVar12 + ((ulong)puVar54 & 0xffff) + 0x30000) = (char)uVar45;
        if (0xfffe < uVar48) {
          uVar48 = 0xffff;
        }
        *(short *)((long)pvVar12 + uVar56 * 4 + (ulong)(uVar49 << 0xb) + 0x40000) = (short)uVar48;
        *(undefined2 *)((long)pvVar12 + uVar56 * 4 + (ulong)(uVar49 << 0xb) + 0x40002) =
             *(undefined2 *)((long)pvVar12 + uVar25 * 2 + 0x20000);
        *(uint *)((long)pvVar12 + uVar25 * 4) = (uint)puVar54;
        *(short *)((long)pvVar12 + uVar25 * 2 + 0x20000) = (short)uVar56;
        puVar23 = puVar23 + -1;
        pvVar12 = (s->hasher_).privat._H42.extra;
        uVar49 = (uint)(*(int *)(data + ((uint)puVar23 & uVar8)) * 0x1e35a7bd) >> 0x11;
        uVar48 = (ulong)uVar49;
        uVar45 = uVar49 & 0x1ff;
        uVar7 = *(ushort *)((long)s->saved_dist_cache_ + (ulong)uVar45 * 2 + 0x58);
        *(ushort *)((long)s->saved_dist_cache_ + (ulong)uVar45 * 2 + 0x58) = uVar7 + 1;
        uVar25 = (ulong)uVar7 & 0x1ff;
        uVar56 = (long)puVar23 - (ulong)*(uint *)((long)pvVar12 + uVar48 * 4);
        *(char *)((long)pvVar12 + ((ulong)puVar23 & 0xffff) + 0x30000) = (char)uVar49;
        if (0xfffe < uVar56) {
          uVar56 = 0xffff;
        }
        *(short *)((long)pvVar12 + uVar25 * 4 + (ulong)(uVar45 << 0xb) + 0x40000) = (short)uVar56;
        *(undefined2 *)((long)pvVar12 + uVar25 * 4 + (ulong)(uVar45 << 0xb) + 0x40002) =
             *(undefined2 *)((long)pvVar12 + uVar48 * 2 + 0x20000);
        *(uint *)((long)pvVar12 + uVar48 * 4) = (uint)puVar23;
        *(short *)((long)pvVar12 + uVar48 * 2 + 0x20000) = (short)uVar25;
      }
      break;
    default:
      if (iVar21 == 0x36) {
        if (2 < uVar18 && 6 < uVar49) {
          uVar45 = uVar18 - 3;
          puVar22 = (s->hasher_).privat._H2.buckets_;
          uVar49 = 0xfffff;
          puVar22[(uint)((ulong)(*(long *)(data + (uVar45 & uVar8)) * 0x35a7bd1e35a7bd00) >> 0x2c) +
                  (uVar45 & 0x18) & 0xfffff] = uVar45;
          uVar45 = uVar18 - 2;
          puVar22[(uint)((ulong)(*(long *)(data + (uVar45 & uVar8)) * 0x35a7bd1e35a7bd00) >> 0x2c) +
                  (uVar45 & 0x18) & 0xfffff] = uVar45;
          uVar45 = (uint)((ulong)(*(long *)(data + (uVar18 - 1 & uVar8)) * 0x35a7bd1e35a7bd00) >>
                         0x2c);
          goto LAB_0012c76b;
        }
      }
      else {
        uVar13 = (undefined3)((uint)iVar21 >> 8);
        if (iVar21 == 0x37) {
          puVar40 = (uint32_t *)(ulong)CONCAT31(uVar13,uVar49 < 7);
          if (2 < uVar18 && uVar49 >= 7) {
            uVar45 = uVar18 - 3;
            puVar40 = (s->hasher_).privat._H2.buckets_;
            uVar49 = 0xfffff;
            puVar40[(uint)((ulong)(*(long *)(data + (uVar45 & uVar8)) * 0x35a7bd1e35a7bd00) >> 0x2c)
                    + (uVar45 & 0x18) & 0xfffff] = uVar45;
            uVar45 = uVar18 - 2;
            puVar40[(uint)((ulong)(*(long *)(data + (uVar45 & uVar8)) * 0x35a7bd1e35a7bd00) >> 0x2c)
                    + (uVar45 & 0x18) & 0xfffff] = uVar45;
            uVar45 = (uint)((ulong)(*(long *)(data + (uVar18 - 1 & uVar8)) * 0x35a7bd1e35a7bd00) >>
                           0x2c);
            uVar46 = uVar18 - 1 & 0x18;
            goto LAB_0012c69a;
          }
          goto LAB_0012c6a1;
        }
        if (iVar21 == 0x41) {
          puVar54 = (uint8_t *)(ulong)CONCAT31(uVar13,uVar18 < 3 || uVar49 < 7);
          if (uVar18 >= 3 && uVar49 >= 7) {
            uVar48 = (s->hasher_).privat._H6.hash_mask_;
            uVar25 = (*(ulong *)(data + (uVar18 - 3 & uVar8)) & uVar48) * 0x1fe35a7bd3579bd3 >>
                     (*(byte *)((long)&(s->hasher_).privat + 0x10) & 0x3f);
            puVar10 = (s->hasher_).privat._H6.num_;
            puVar40 = (s->hasher_).privat._H6.buckets_;
            uVar56 = uVar25 & 0xffffffff;
            uVar7 = puVar10[uVar56];
            uVar45 = (s->hasher_).privat._H6.block_mask_;
            bVar32 = *(byte *)((long)&(s->hasher_).privat + 0x24);
            puVar10[uVar56] = uVar7 + 1;
            puVar40[(ulong)(uVar45 & uVar7) + (ulong)(uint)((int)uVar25 << (bVar32 & 0x1f))] =
                 uVar18 - 3;
            bVar32 = *(byte *)((long)&(s->hasher_).privat + 0x24);
            uVar25 = (*(ulong *)(data + (uVar18 - 2 & uVar8)) & uVar48) * 0x1fe35a7bd3579bd3 >>
                     (*(byte *)((long)&(s->hasher_).privat + 0x10) & 0x3f);
            uVar56 = uVar25 & 0xffffffff;
            uVar7 = puVar10[uVar56];
            uVar45 = (s->hasher_).privat._H6.block_mask_;
            puVar10[uVar56] = uVar7 + 1;
            puVar40[(ulong)(uVar45 & uVar7) + (ulong)(uint)((int)uVar25 << (bVar32 & 0x1f))] =
                 uVar18 - 2;
            uVar25 = (uVar48 & *(ulong *)(data + (uVar18 - 1 & uVar8))) * 0x1fe35a7bd3579bd3 >>
                     (*(byte *)((long)&(s->hasher_).privat + 0x10) & 0x3f);
            uVar48 = uVar25 & 0xffffffff;
            uVar7 = puVar10[uVar48];
            uVar45 = (s->hasher_).privat._H6.block_mask_;
            puVar54 = (uint8_t *)
                      (CONCAT71((int7)((ulong)s >> 8),
                                *(undefined1 *)((long)&(s->hasher_).privat + 0x24)) & 0xffffffff);
            puVar10[uVar48] = uVar7 + 1;
            puVar40[(ulong)(uVar45 & uVar7) + (ulong)(uint)((int)uVar25 << ((byte)puVar54 & 0x1f))]
                 = uVar18 - 1;
          }
          puVar40 = (uint32_t *)(mask - (uVar8 & uVar18));
          if (puVar22 <= puVar40) {
            puVar40 = puVar22;
          }
          PrepareHROLLING(&(s->hasher_).privat._H65.hb,(int)puVar40,
                          (size_t)(data + (uVar8 & uVar18)),puVar54);
          *(uint8_t **)&(s->hasher_).privat._H35.hb_common.params.block_bits = puVar23;
        }
      }
    }
  }
  uVar9 = s->last_flush_pos_;
  uVar19 = WrapPosition(uVar9);
  CVar20 = ChooseContextMode(&s->params,data,(ulong)uVar19,mask,s->input_pos_ - uVar9);
  local_8e0 = CONCAT44(extraout_var,CVar20);
  sVar39 = s->num_commands_;
  if ((sVar39 != 0) && (s->last_insert_len_ == 0)) {
    pCVar26 = s->commands_;
    uVar25 = (1L << ((byte)(s->params).lgwin & 0x3f)) - 0x10;
    uVar45 = pCVar26[sVar39 - 1].copy_len_;
    uVar49 = uVar45 & 0x1ffffff;
    uVar48 = s->last_processed_pos_ - (ulong)uVar49;
    if (uVar25 <= uVar48) {
      uVar48 = uVar25;
    }
    iVar21 = s->dist_cache_[0];
    uVar7 = pCVar26[sVar39 - 1].dist_prefix_;
    uVar53 = uVar7 & 0x3ff;
    uVar19 = (s->params).dist.num_direct_distance_codes;
    uVar46 = uVar19 + 0x10;
    if (uVar46 <= uVar53) {
      uVar34 = (s->params).dist.distance_postfix_bits;
      bVar32 = (byte)uVar34;
      uVar53 = (uVar53 - uVar19) - 0x10;
      uVar53 = (~(-1 << (bVar32 & 0x1f)) & uVar53) + uVar46 +
               (pCVar26[sVar39 - 1].dist_extra_ +
                (((uVar53 >> (uVar34 & 0x1f) & 1) != 0) + 2 << ((byte)(uVar7 >> 10) & 0x1f)) + -4 <<
               (bVar32 & 0x1f));
    }
    if ((ulong)(uVar53 - 0xf) == (long)iVar21 || uVar53 < 0x10) {
      if ((ulong)(long)iVar21 <= uVar48) {
        uVar49 = (s->ringbuffer_).mask_;
        puVar23 = (s->ringbuffer_).buffer_;
        iVar38 = uVar18 + (int)local_970;
        uVar48 = (ulong)local_938 & 0xffffffff;
        while ((iVar50 = (int)uVar48, uVar48 = (ulong)(iVar50 - 1), uVar46 = iVar38 - (int)local_940
               , iVar50 != 0 &&
               (uVar46 = uVar18, puVar23[uVar18 & uVar49] == puVar23[uVar18 - iVar21 & uVar49]))) {
          uVar45 = uVar45 + 1;
          pCVar26[sVar39 - 1].copy_len_ = uVar45;
          uVar18 = uVar18 + 1;
          local_938 = (BlockSplitFromDecoder *)uVar48;
        }
        uVar18 = uVar46;
        uVar49 = uVar45 & 0x1ffffff;
      }
      uVar46 = pCVar26[sVar39 - 1].insert_len_;
      uVar49 = (uVar45 >> 0x19) + uVar49;
      uVar45 = uVar46;
      if (5 < (ulong)uVar46) {
        if (uVar46 < 0x82) {
          uVar48 = (ulong)uVar46 - 2;
          uVar45 = 0x1f;
          uVar46 = (uint)uVar48;
          if (uVar46 != 0) {
            for (; uVar46 >> uVar45 == 0; uVar45 = uVar45 - 1) {
            }
          }
          uVar45 = (int)(uVar48 >> ((char)(uVar45 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                   (uVar45 ^ 0xffffffe0) * 2 + 0x40;
        }
        else if (uVar46 < 0x842) {
          uVar45 = 0x1f;
          if (uVar46 - 0x42 != 0) {
            for (; uVar46 - 0x42 >> uVar45 == 0; uVar45 = uVar45 - 1) {
            }
          }
          uVar45 = (uVar45 ^ 0xffe0) + 0x2a;
        }
        else {
          uVar45 = 0x15;
          if (0x1841 < uVar46) {
            uVar45 = (uint)(ushort)(0x17 - (uVar46 < 0x5842));
          }
        }
      }
      if (uVar49 < 10) {
        uVar46 = uVar49 - 2;
      }
      else if (uVar49 < 0x86) {
        uVar46 = 0x1f;
        uVar53 = (uint)((ulong)uVar49 - 6);
        if (uVar53 != 0) {
          for (; uVar53 >> uVar46 == 0; uVar46 = uVar46 - 1) {
          }
        }
        uVar46 = (int)((ulong)uVar49 - 6 >> ((char)(uVar46 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                 (uVar46 ^ 0xffffffe0) * 2 + 0x42;
      }
      else {
        uVar46 = 0x17;
        if (uVar49 < 0x846) {
          uVar46 = 0x1f;
          if (uVar49 - 0x46 != 0) {
            for (; uVar49 - 0x46 >> uVar46 == 0; uVar46 = uVar46 - 1) {
            }
          }
          uVar46 = (uVar46 ^ 0xffe0) + 0x2c;
        }
      }
      uVar16 = (ushort)uVar46;
      uVar37 = (uVar16 & 7) + ((ushort)uVar45 & 7) * 8;
      if ((((uVar7 & 0x3ff) == 0) && ((ushort)uVar45 < 8)) && (uVar16 < 0x10)) {
        if (7 < uVar16) {
          uVar37 = uVar37 + 0x40;
        }
      }
      else {
        iVar21 = ((uVar45 & 0xffff) >> 3) * 3 + ((uVar46 & 0xffff) >> 3);
        uVar37 = uVar37 + ((ushort)(0x520d40 >> ((char)iVar21 * '\x02' & 0x1fU)) & 0xc0) +
                          (short)iVar21 * 0x40 + 0x40;
      }
      pCVar26[sVar39 - 1].cmd_prefix_ = uVar37;
    }
  }
  psVar52 = &s->num_commands_;
  literal_context_lut = "" + (CVar20 << 9);
  iVar21 = (s->params).quality;
  uVar25 = (ulong)local_938 & 0xffffffff;
  uVar48 = (ulong)uVar18;
  piVar24 = s->dist_cache_;
  last_insert_len = &s->last_insert_len_;
  pCVar26 = s->commands_ + sVar39;
  num_literals = &s->num_literals_;
  if (iVar21 == 0xb) {
    BrotliCreateHqZopfliBackwardReferences
              (m,uVar25,uVar48,data,mask,literal_context_lut,&s->params,hasher,piVar24,
               last_insert_len,pCVar26,psVar52,num_literals);
  }
  else if (iVar21 == 10) {
    BrotliCreateZopfliBackwardReferences
              (m,uVar25,uVar48,data,mask,literal_context_lut,&s->params,hasher,piVar24,
               last_insert_len,pCVar26,psVar52,num_literals);
  }
  else {
    BrotliCreateBackwardReferences
              (uVar25,uVar48,data,mask,literal_context_lut,&s->params,hasher,piVar24,last_insert_len
               ,pCVar26,psVar52,num_literals,s->backward_references_,&s->back_refs_position_,
               s->back_refs_size_);
  }
  iVar21 = (s->params).lgwin;
  iVar38 = (s->params).lgblock;
  if (iVar21 <= iVar38) {
    iVar21 = iVar38;
  }
  cVar33 = '\x17';
  if (iVar21 < 0x17) {
    cVar33 = (char)iVar21;
  }
  uVar48 = 1L << (cVar33 + 1U & 0x3f);
  uVar9 = s->input_pos_;
  uVar35 = s->last_flush_pos_;
  if ((s->params).quality < 4) {
    bVar31 = 0x2ffe < s->num_commands_ + s->num_literals_;
  }
  else {
    bVar31 = false;
  }
  uVar25 = uVar9 - uVar35;
  uVar18 = (uint)local_900 | is_last;
  local_900 = (uint8_t *)CONCAT44(local_900._4_4_,uVar18);
  if (((uVar18 == 0) && (!bVar31)) &&
     (((1L << ((byte)iVar38 & 0x3f)) + uVar25 <= uVar48 &&
      ((uVar48 = uVar48 >> 3, s->num_literals_ < uVar48 && (*psVar52 < uVar48)))))) {
    iVar21 = UpdateLastProcessedPos(s);
    if (iVar21 != 0) {
      *local_8e8 = 0;
    }
LAB_0012ced8:
    *local_978 = 0;
    return 1;
  }
  uVar48 = s->last_insert_len_;
  if (uVar48 != 0) {
    pCVar26 = s->commands_;
    sVar39 = s->num_commands_;
    s->num_commands_ = sVar39 + 1;
    pCVar26[sVar39].insert_len_ = (uint32_t)uVar48;
    pCVar26[sVar39].copy_len_ = 0x8000000;
    pCVar26[sVar39].dist_extra_ = 0;
    pCVar26[sVar39].dist_prefix_ = 0x10;
    if (uVar48 < 6) {
      uVar56 = uVar48 & 0xffffffff;
    }
    else if (uVar48 < 0x82) {
      uVar18 = 0x1f;
      uVar45 = (uint)(uVar48 - 2);
      if (uVar45 != 0) {
        for (; uVar45 >> uVar18 == 0; uVar18 = uVar18 - 1) {
        }
      }
      uVar56 = (ulong)((int)(uVar48 - 2 >> ((char)(uVar18 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                       (uVar18 ^ 0xffffffe0) * 2 + 0x40);
    }
    else if (uVar48 < 0x842) {
      uVar45 = (uint32_t)uVar48 - 0x42;
      uVar18 = 0x1f;
      if (uVar45 != 0) {
        for (; uVar45 >> uVar18 == 0; uVar18 = uVar18 - 1) {
        }
      }
      uVar56 = (ulong)((uVar18 ^ 0xffe0) + 0x2a);
    }
    else {
      uVar56 = 0x15;
      if (0x1841 < uVar48) {
        uVar56 = (ulong)(ushort)(0x17 - (uVar48 < 0x5842));
      }
    }
    iVar21 = (int)((uVar56 & 0xffff) >> 3) * 3;
    pCVar26[sVar39].cmd_prefix_ =
         ((ushort)(0x520d40 >> ((char)iVar21 * '\x02' & 0x1fU)) & 0xc0) + (short)iVar21 * 0x40 +
         ((ushort)uVar56 & 7) * 8 + 0x42;
    s->num_literals_ = s->num_literals_ + uVar48;
    s->last_insert_len_ = 0;
  }
  if (uVar9 == uVar35 && is_last == 0) goto LAB_0012ced8;
  local_930 = piVar24;
  puVar23 = GetBrotliStorage(s,(ulong)((int)uVar25 * 2 + 0x1f7));
  storage_ix_1 = (size_t)s->last_bytes_bits_;
  *puVar23 = (uint8_t)s->last_bytes_;
  puVar23[1] = *(uint8_t *)((long)&s->last_bytes_ + 1);
  uVar9 = s->last_flush_pos_;
  local_968 = (double)CONCAT71(local_968._1_7_,s->prev_byte_);
  local_988 = (double)CONCAT71(local_988._1_7_,s->prev_byte2_);
  sVar39 = s->num_literals_;
  pCVar26 = s->commands_;
  sVar43 = s->num_commands_;
  local_970 = s->saved_dist_cache_;
  literals_block_splits_decoder = s->literals_block_splits_decoder_;
  local_938 = s->cmds_block_splits_decoder_;
  uVar19 = WrapPosition(uVar9);
  memcpy(&block_params,s,0x90);
  uVar35 = uVar25 & 0xffffffff;
  if (uVar35 == 0) {
    *(ulong *)(puVar23 + (storage_ix_1 >> 3)) =
         3L << ((byte)storage_ix_1 & 7) | (ulong)puVar23[storage_ix_1 >> 3];
    storage_ix_1 = (size_t)((int)storage_ix_1 + 9U & 0xfffffff8);
    psVar52 = local_978;
    piVar24 = local_970;
    goto LAB_0012df00;
  }
  local_900 = puVar23;
  iVar21 = ShouldCompress(data,mask,uVar9,uVar35,sVar39,sVar43);
  puVar23 = local_900;
  piVar24 = local_970;
  uVar48 = (ulong)uVar19;
  if (iVar21 == 0) {
    uVar14 = *(undefined8 *)(local_970 + 2);
    *(undefined8 *)local_930 = *(undefined8 *)local_970;
    *(undefined8 *)(local_930 + 2) = uVar14;
    BrotliStoreUncompressedMetaBlock(is_last,data,uVar48,mask,uVar35,&storage_ix_1,local_900);
    psVar52 = local_978;
    goto LAB_0012df00;
  }
  uVar3 = *local_900;
  uVar4 = local_900[1];
  local_8b0 = storage_ix_1 & 0xff;
  iVar21 = (s->params).quality;
  local_940 = uVar35;
  if (iVar21 < 3) {
    BrotliStoreMetaBlockFast
              (m,data,uVar48,uVar35,mask,is_last,&s->params,pCVar26,sVar43,&storage_ix_1,local_900);
  }
  else if (iVar21 == 3) {
    BrotliStoreMetaBlockTrivial
              (m,data,uVar48,uVar35,mask,is_last,&s->params,pCVar26,sVar43,&storage_ix_1,local_900);
  }
  else {
    psVar52 = &s->current_block_cmds_;
    BrotliInitBlockSplit((BlockSplit *)&table_size);
    BrotliInitBlockSplit(&local_7f8);
    BrotliInitBlockSplit(&local_7c8);
    local_758 = (HistogramDistance *)0x0;
    sStack_750 = 0;
    local_768 = (HistogramCommand *)0x0;
    sStack_760 = 0;
    local_778 = (HistogramLiteral *)0x0;
    sStack_770 = 0;
    local_788 = (uint32_t *)0x0;
    sStack_780 = 0;
    local_798 = (uint32_t *)0x0;
    sStack_790 = 0;
    iVar21 = (s->params).quality;
    local_908 = (ulong)local_988 & 0xff;
    local_98c = (uint)local_968._0_1_;
    if (iVar21 < 10) {
      local_8b8 = &s->current_block_literals_;
      uVar47 = local_988._0_1_;
      if ((s->params).disable_literal_context_modeling == 0) {
        local_8d8 = psVar52;
        local_8cc = iVar21;
        if ((uint)local_940 < 0x40 || iVar21 < 5) {
          static_context_map = (undefined1 *)0x0;
        }
        else {
          end_pos = local_940 + uVar48;
          if ((s->params).size_hint < 0x100000) {
LAB_0012d5a8:
            local_928 = 1.48219693752374e-323;
            puVar30 = monogram_histo + 1;
            local_6a8 = 0;
            uStack_6a0 = 0;
            local_698 = 0;
            storage_ix = 0;
            uStack_6b0 = 0;
            for (uVar25 = uVar48; uVar25 + 0x40 <= end_pos; uVar25 = uVar25 + 0x1000) {
              piVar24 = (int *)(DecideOverLiteralContextModeling_lut +
                               (ulong)(data[(uint)uVar25 & uVar8] >> 6) * 4);
              for (lVar36 = 1; lVar36 != 0x40; lVar36 = lVar36 + 1) {
                iVar21 = *piVar24;
                piVar24 = (int *)(DecideOverLiteralContextModeling_lut +
                                 (ulong)(data[uVar8 & (uint)uVar25 + (int)lVar36] >> 6) * 4);
                piVar2 = (int *)((long)&storage_ix + ((long)*piVar24 + (long)iVar21 * 3) * 4);
                *piVar2 = *piVar2 + 1;
              }
            }
            puVar22 = monogram_histo;
            monogram_histo[2] = 0;
            monogram_histo[0] = 0;
            monogram_histo[1] = 0;
            combined_histo[0] = 0;
            combined_histo[1] = 0;
            combined_histo[2] = 0;
            combined_histo[3] = 0;
            combined_histo[4] = 0;
            combined_histo[5] = 0;
            for (uVar25 = 0; uVar25 != 9; uVar25 = uVar25 + 1) {
              iVar21 = *(int *)((long)&storage_ix + uVar25 * 4);
              puVar22[(uVar25 / 3) * -3] = puVar22[(uVar25 / 3) * -3] + iVar21;
              uVar56 = uVar25;
              if (5 < uVar25) {
                uVar56 = uVar25 - 6;
              }
              combined_histo[uVar56] = combined_histo[uVar56] + iVar21;
              puVar22 = puVar22 + 1;
            }
            bVar31 = true;
            puVar29 = monogram_histo;
            local_958 = 0.0;
            uStack_950 = 0;
            lVar36 = 0;
            while( true ) {
              uVar25 = (ulong)*puVar29;
              if (uVar25 < 0x100) {
                dVar59 = kLog2Table[uVar25];
              }
              else {
                dVar59 = log2((double)uVar25);
              }
              uVar56 = lVar36 + uVar25;
              local_958 = local_958 - (double)uVar25 * dVar59;
              if (!bVar31) break;
              uVar25 = (ulong)*puVar30;
              if (uVar25 < 0x100) {
                dVar59 = kLog2Table[uVar25];
              }
              else {
                dVar59 = log2((double)uVar25);
              }
              lVar36 = uVar56 + uVar25;
              local_958 = local_958 - (double)uVar25 * dVar59;
              bVar31 = false;
              puVar29 = monogram_histo + 2;
              puVar30 = &local_8ec;
            }
            if (uVar56 != 0) {
              auVar64._8_4_ = (int)(uVar56 >> 0x20);
              auVar64._0_8_ = uVar56;
              auVar64._12_4_ = 0x45300000;
              dVar59 = (auVar64._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar56) - 4503599627370496.0);
              if (uVar56 < 0x100) {
                dVar68 = kLog2Table[uVar56];
              }
              else {
                dVar68 = log2(dVar59);
              }
              local_958 = local_958 + dVar59 * dVar68;
            }
            bVar31 = true;
            local_988 = 0.0;
            uStack_980 = 0;
            lVar36 = 0;
            puVar30 = combined_histo;
            puVar29 = combined_histo + 1;
            while( true ) {
              uVar25 = (ulong)*puVar30;
              if (uVar25 < 0x100) {
                dVar59 = kLog2Table[uVar25];
              }
              else {
                dVar59 = log2((double)uVar25);
              }
              uVar56 = lVar36 + uVar25;
              local_988 = local_988 - (double)uVar25 * dVar59;
              if (!bVar31) break;
              uVar25 = (ulong)*puVar29;
              if (uVar25 < 0x100) {
                dVar59 = kLog2Table[uVar25];
              }
              else {
                dVar59 = log2((double)uVar25);
              }
              lVar36 = uVar56 + uVar25;
              local_988 = local_988 - (double)uVar25 * dVar59;
              bVar31 = false;
              puVar30 = combined_histo + 2;
              puVar29 = combined_histo + 3;
            }
            if (uVar56 != 0) {
              auVar65._8_4_ = (int)(uVar56 >> 0x20);
              auVar65._0_8_ = uVar56;
              auVar65._12_4_ = 0x45300000;
              dVar59 = (auVar65._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar56) - 4503599627370496.0);
              if (uVar56 < 0x100) {
                dVar68 = kLog2Table[uVar56];
              }
              else {
                dVar68 = log2(dVar59);
              }
              local_988 = local_988 + dVar59 * dVar68;
            }
            uVar25 = 0xc;
            local_918 = 0.0;
            uStack_910 = 0;
            lVar36 = 0;
            while( true ) {
              uVar56 = (ulong)*(uint *)((long)combined_histo + uVar25);
              if (uVar56 < 0x100) {
                dVar59 = kLog2Table[uVar56];
              }
              else {
                dVar59 = log2((double)uVar56);
              }
              uVar55 = lVar36 + uVar56;
              local_918 = local_918 - (double)uVar56 * dVar59;
              if (0x13 < uVar25) break;
              uVar56 = (ulong)*(uint *)((long)combined_histo + uVar25 + 4);
              if (uVar56 < 0x100) {
                dVar59 = kLog2Table[uVar56];
              }
              else {
                dVar59 = log2((double)uVar56);
              }
              lVar36 = uVar55 + uVar56;
              local_918 = local_918 - (double)uVar56 * dVar59;
              uVar25 = uVar25 + 8;
            }
            if (uVar55 != 0) {
              auVar66._8_4_ = (int)(uVar55 >> 0x20);
              auVar66._0_8_ = uVar55;
              auVar66._12_4_ = 0x45300000;
              dVar59 = (auVar66._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar55) - 4503599627370496.0);
              if (uVar55 < 0x100) {
                dVar68 = kLog2Table[uVar55];
              }
              else {
                dVar68 = log2(dVar59);
              }
              local_918 = local_918 + dVar59 * dVar68;
            }
            local_9a8 = 0.0;
            lVar36 = 0;
            while (lVar36 != 3) {
              bVar31 = true;
              dVar59 = 0.0;
              lVar28 = 0;
              uVar25 = 0;
              local_948 = lVar36;
              while( true ) {
                uVar56 = (ulong)*(uint *)((long)&storage_ix + uVar25 + lVar36 * 0xc);
                dVar68 = (double)uVar56;
                if (uVar56 < 0x100) {
                  dVar60 = kLog2Table[uVar56];
                }
                else {
                  local_968 = dVar68;
                  dVar60 = log2(dVar68);
                  dVar68 = local_968;
                }
                lVar41 = local_948;
                uVar56 = lVar28 + uVar56;
                dVar59 = dVar59 - dVar68 * dVar60;
                if (!bVar31) break;
                uVar25 = (ulong)*(uint *)((long)&storage_ix + (uVar25 | 4) + lVar36 * 0xc);
                dVar68 = (double)uVar25;
                if (uVar25 < 0x100) {
                  dVar60 = kLog2Table[uVar25];
                }
                else {
                  local_968 = dVar68;
                  dVar60 = log2(dVar68);
                  dVar68 = local_968;
                }
                lVar28 = uVar56 + uVar25;
                dVar59 = dVar59 - dVar68 * dVar60;
                bVar31 = false;
                uVar25 = 8;
              }
              if (uVar56 != 0) {
                auVar67._8_4_ = (int)(uVar56 >> 0x20);
                auVar67._0_8_ = uVar56;
                auVar67._12_4_ = 0x45300000;
                dVar60 = auVar67._8_8_ - 1.9342813113834067e+25;
                dVar68 = dVar60 + ((double)CONCAT44(0x43300000,(int)uVar56) - 4503599627370496.0);
                if (uVar56 < 0x100) {
                  dVar60 = kLog2Table[uVar56];
                }
                else {
                  local_968 = dVar68;
                  dStack_960 = dVar60;
                  dVar60 = log2(dVar68);
                  dVar68 = local_968;
                }
                dVar59 = dVar59 + dVar68 * dVar60;
              }
              local_9a8 = local_9a8 + dVar59;
              lVar36 = lVar41 + 1;
            }
            dVar59 = 1.0 / (double)(monogram_histo[1] + monogram_histo[0] + monogram_histo[2]);
            dVar68 = local_958 * dVar59;
            dVar60 = (local_988 + local_918) * dVar59;
            if (local_8cc < 7) {
              local_9a8 = dVar68 * 10.0;
            }
            else {
              local_9a8 = local_9a8 * dVar59;
            }
            if ((0.2 <= dVar68 - dVar60) || (0.2 <= dVar68 - local_9a8)) {
              if (dVar60 - local_9a8 < 0.02) {
                static_context_map = ChooseContextMap_kStaticContextMapSimpleUTF8;
                local_928 = 9.88131291682493e-324;
              }
              else {
                static_context_map = ChooseContextMap_kStaticContextMapContinuation;
              }
            }
            else {
              static_context_map = (undefined1 *)0x0;
              local_928 = 4.94065645841247e-324;
            }
          }
          else {
            combined_histo[0x1c] = 0;
            combined_histo[0x1d] = 0;
            combined_histo[0x1e] = 0;
            combined_histo[0x1f] = 0;
            combined_histo[0x18] = 0;
            combined_histo[0x19] = 0;
            combined_histo[0x1a] = 0;
            combined_histo[0x1b] = 0;
            combined_histo[0x14] = 0;
            combined_histo[0x15] = 0;
            combined_histo[0x16] = 0;
            combined_histo[0x17] = 0;
            combined_histo[0x10] = 0;
            combined_histo[0x11] = 0;
            combined_histo[0x12] = 0;
            combined_histo[0x13] = 0;
            combined_histo[0xc] = 0;
            combined_histo[0xd] = 0;
            combined_histo[0xe] = 0;
            combined_histo[0xf] = 0;
            combined_histo[8] = 0;
            combined_histo[9] = 0;
            combined_histo[10] = 0;
            combined_histo[0xb] = 0;
            combined_histo[4] = 0;
            combined_histo[5] = 0;
            combined_histo[6] = 0;
            combined_histo[7] = 0;
            combined_histo[0] = 0;
            combined_histo[1] = 0;
            combined_histo[2] = 0;
            combined_histo[3] = 0;
            memset(&storage_ix,0,0x680);
            local_9a8 = 0.0;
            static_context_map = ShouldUseComplexStaticContextMap_kStaticContextMapComplexUTF8;
            for (uVar25 = uVar48; uVar25 + 0x40 <= end_pos; uVar25 = uVar25 + 0x1000) {
              uVar18 = (uint)uVar25;
              bVar32 = data[uVar18 + 1 & uVar8];
              uVar56 = (ulong)data[uVar18 & uVar8];
              for (lVar36 = 2; uVar55 = (ulong)bVar32, lVar36 != 0x40; lVar36 = lVar36 + 1) {
                bVar5 = ""[uVar56 + 0x500];
                bVar6 = ""[uVar55 + 0x400];
                bVar32 = data[uVar18 + (int)lVar36 & uVar8];
                combined_histo[bVar32 >> 3] = combined_histo[bVar32 >> 3] + 1;
                piVar24 = (int *)((long)&storage_ix +
                                 (ulong)(bVar32 >> 3) * 4 +
                                 (ulong)(byte)ShouldUseComplexStaticContextMap_kStaticContextMapComplexUTF8
                                              [(ulong)(bVar5 | bVar6) * 4] * 0x80);
                *piVar24 = *piVar24 + 1;
                uVar56 = uVar55;
              }
              local_9a8 = local_9a8 + 62.0;
            }
            local_928 = 0.0;
            uStack_920 = 0;
            uVar25 = 0;
            for (uVar56 = 0; uVar56 < 0x80; uVar56 = uVar56 + 8) {
              uVar55 = (ulong)*(uint *)((long)combined_histo + uVar56);
              if (uVar55 < 0x100) {
                dVar59 = kLog2Table[uVar55];
              }
              else {
                dVar59 = log2((double)uVar55);
              }
              uVar51 = (ulong)*(uint *)((long)combined_histo + uVar56 + 4);
              dVar68 = (double)uVar51;
              if (uVar51 < 0x100) {
                dVar60 = kLog2Table[uVar51];
              }
              else {
                local_988 = dVar68;
                local_968 = dVar59;
                dVar60 = log2(dVar68);
                dVar59 = local_968;
                dVar68 = local_988;
              }
              uVar25 = uVar25 + uVar55 + uVar51;
              local_928 = (local_928 - (double)uVar55 * dVar59) - dVar68 * dVar60;
            }
            if (uVar25 != 0) {
              auVar62._8_4_ = (int)(uVar25 >> 0x20);
              auVar62._0_8_ = uVar25;
              auVar62._12_4_ = 0x45300000;
              dVar59 = (auVar62._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar25) - 4503599627370496.0);
              if (uVar25 < 0x100) {
                dVar68 = kLog2Table[uVar25];
              }
              else {
                dVar68 = log2(dVar59);
              }
              local_928 = local_928 + dVar59 * dVar68;
            }
            dVar59 = 0.0;
            lVar36 = (long)&storage_ix + 4;
            lVar28 = 0;
            while (lVar28 != 0xd) {
              dVar68 = 0.0;
              uVar25 = 0;
              local_988 = dVar59;
              local_948 = lVar28;
              for (uVar56 = 0; uVar56 < 0x80; uVar56 = uVar56 + 8) {
                uVar55 = (ulong)*(uint *)(lVar36 + -4 + uVar56);
                local_968 = (double)uVar55;
                if (uVar55 < 0x100) {
                  dVar59 = kLog2Table[uVar55];
                }
                else {
                  dVar59 = log2(local_968);
                }
                uVar51 = (ulong)*(uint *)(lVar36 + uVar56);
                dVar60 = (double)uVar51;
                if (uVar51 < 0x100) {
                  dVar61 = kLog2Table[uVar51];
                }
                else {
                  local_958 = dVar60;
                  local_918 = dVar59;
                  dVar61 = log2(dVar60);
                  dVar59 = local_918;
                  dVar60 = local_958;
                }
                uVar25 = uVar25 + uVar55 + uVar51;
                dVar68 = (dVar68 - local_968 * dVar59) - dVar60 * dVar61;
              }
              if (uVar25 != 0) {
                auVar63._8_4_ = (int)(uVar25 >> 0x20);
                auVar63._0_8_ = uVar25;
                auVar63._12_4_ = 0x45300000;
                dVar60 = auVar63._8_8_ - 1.9342813113834067e+25;
                dVar59 = dVar60 + ((double)CONCAT44(0x43300000,(int)uVar25) - 4503599627370496.0);
                if (uVar25 < 0x100) {
                  dVar60 = kLog2Table[uVar25];
                }
                else {
                  local_968 = dVar59;
                  dStack_960 = dVar60;
                  dVar60 = log2(dVar59);
                  dVar59 = local_968;
                }
                dVar68 = dVar68 + dVar59 * dVar60;
              }
              dVar59 = local_988 + dVar68;
              lVar36 = lVar36 + 0x80;
              lVar28 = local_948 + 1;
            }
            dVar59 = dVar59 * (1.0 / local_9a8);
            if ((3.0 < dVar59) || ((1.0 / local_9a8) * local_928 - dVar59 < 0.2)) goto LAB_0012d5a8;
            local_928 = 6.42285339593621e-323;
          }
          uVar47 = (uint8_t)local_908;
        }
        bVar32 = (byte)local_98c;
        psVar52 = local_8d8;
      }
      else {
        static_context_map = (undefined1 *)0x0;
        bVar32 = local_968._0_1_;
      }
      BrotliBuildMetaBlockGreedy
                (m,data,uVar48,mask,bVar32,uVar47,literal_context_lut,(size_t)local_928,
                 (uint32_t *)static_context_map,pCVar26,sVar43,literals_block_splits_decoder,
                 local_8b8,local_938,psVar52,(MetaBlockSplit *)&table_size);
    }
    else {
      BrotliBuildMetaBlock
                (m,data,uVar48,mask,&block_params,local_968._0_1_,local_988._0_1_,pCVar26,sVar43,
                 (ContextType)local_8e0,literals_block_splits_decoder,&s->current_block_literals_,
                 local_938,psVar52,(MetaBlockSplit *)&table_size);
    }
    if (3 < (s->params).quality) {
      BrotliOptimizeHistograms(block_params.dist.alphabet_size_limit,(MetaBlockSplit *)&table_size);
    }
    puVar23 = local_900;
    uVar35 = local_940;
    BrotliStoreMetaBlock
              (m,data,uVar48,local_940,mask,(uint8_t)local_98c,(uint8_t)local_908,is_last,
               &block_params,(ContextType)local_8e0,pCVar26,sVar43,(MetaBlockSplit *)&table_size,
               &storage_ix_1,local_900);
    BrotliDestroyBlockSplit(m,(BlockSplit *)&table_size);
    BrotliDestroyBlockSplit(m,&local_7f8);
    BrotliDestroyBlockSplit(m,&local_7c8);
    BrotliFree(m,local_798);
    local_798 = (uint32_t *)0x0;
    BrotliFree(m,local_788);
    local_788 = (uint32_t *)0x0;
    BrotliFree(m,local_778);
    local_778 = (HistogramLiteral *)0x0;
    BrotliFree(m,local_768);
    local_768 = (HistogramCommand *)0x0;
    BrotliFree(m,local_758);
    piVar24 = local_970;
  }
  psVar52 = local_978;
  if (uVar35 + 4 < storage_ix_1 >> 3) {
    uVar14 = *(undefined8 *)(piVar24 + 2);
    *(undefined8 *)local_930 = *(undefined8 *)piVar24;
    *(undefined8 *)(local_930 + 2) = uVar14;
    *puVar23 = uVar3;
    puVar23[1] = uVar4;
    storage_ix_1 = local_8b0;
    BrotliStoreUncompressedMetaBlock(is_last,data,uVar48,mask,uVar35,&storage_ix_1,puVar23);
  }
LAB_0012df00:
  uVar48 = storage_ix_1 >> 3;
  s->last_bytes_ = (ushort)puVar23[uVar48];
  s->last_bytes_bits_ = (byte)storage_ix_1 & 7;
  s->last_flush_pos_ = s->input_pos_;
  iVar21 = UpdateLastProcessedPos(s);
  if (iVar21 != 0) {
    *local_8e8 = 0;
  }
  uVar9 = s->last_flush_pos_;
  if (uVar9 != 0) {
    s->prev_byte_ = data[uVar8 & (int)uVar9 - 1U];
    if (uVar9 != 1) {
      s->prev_byte2_ = data[uVar8 & (int)uVar9 - 2U];
    }
  }
  s->num_commands_ = 0;
  s->num_literals_ = 0;
  uVar14 = *(undefined8 *)(local_930 + 2);
  *(undefined8 *)piVar24 = *(undefined8 *)local_930;
  *(undefined8 *)(piVar24 + 2) = uVar14;
  *local_8c0 = puVar23;
  *psVar52 = uVar48;
  return 1;
code_r0x0012c03b:
  lVar41 = lVar41 + -8;
  uVar55 = uVar55 + 1;
  goto LAB_0012c019;
}

Assistant:

static BROTLI_BOOL EncodeData(
    BrotliEncoderState* s, const BROTLI_BOOL is_last,
    const BROTLI_BOOL force_flush, size_t* out_size, uint8_t** output) {
  const uint64_t delta = UnprocessedInputSize(s);
  uint32_t bytes = (uint32_t)delta;
  uint32_t wrapped_last_processed_pos = WrapPosition(s->last_processed_pos_);
  uint8_t* data;
  uint32_t mask;
  MemoryManager* m = &s->memory_manager_;
  ContextType literal_context_mode;
  ContextLut literal_context_lut;

  data = s->ringbuffer_.buffer_;
  mask = s->ringbuffer_.mask_;

  /* Adding more blocks after "last" block is forbidden. */
  if (s->is_last_block_emitted_) return BROTLI_FALSE;
  if (is_last) s->is_last_block_emitted_ = BROTLI_TRUE;

  if (delta > InputBlockSize(s)) {
    return BROTLI_FALSE;
  }
  if (s->params.quality == FAST_TWO_PASS_COMPRESSION_QUALITY &&
      !s->command_buf_) {
    s->command_buf_ =
        BROTLI_ALLOC(m, uint32_t, kCompressFragmentTwoPassBlockSize);
    s->literal_buf_ =
        BROTLI_ALLOC(m, uint8_t, kCompressFragmentTwoPassBlockSize);
    if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(s->command_buf_) ||
        BROTLI_IS_NULL(s->literal_buf_)) {
      return BROTLI_FALSE;
    }
  }

  if (s->params.quality == FAST_ONE_PASS_COMPRESSION_QUALITY ||
      s->params.quality == FAST_TWO_PASS_COMPRESSION_QUALITY) {
    uint8_t* storage;
    size_t storage_ix = s->last_bytes_bits_;
    size_t table_size;
    int* table;

    if (delta == 0 && !is_last) {
      /* We have no new input data and we don't have to finish the stream, so
         nothing to do. */
      *out_size = 0;
      return BROTLI_TRUE;
    }
    storage = GetBrotliStorage(s, 2 * bytes + 503);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    storage[0] = (uint8_t)s->last_bytes_;
    storage[1] = (uint8_t)(s->last_bytes_ >> 8);
    table = GetHashTable(s, s->params.quality, bytes, &table_size);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    if (s->params.quality == FAST_ONE_PASS_COMPRESSION_QUALITY) {
      BrotliCompressFragmentFast(
          m, &data[wrapped_last_processed_pos & mask],
          bytes, is_last,
          table, table_size,
          s->cmd_depths_, s->cmd_bits_,
          &s->cmd_code_numbits_, s->cmd_code_,
          &storage_ix, storage);
      if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    } else {
      BrotliCompressFragmentTwoPass(
          m, &data[wrapped_last_processed_pos & mask],
          bytes, is_last,
          s->command_buf_, s->literal_buf_,
          table, table_size,
          &storage_ix, storage);
      if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    }
    s->last_bytes_ = (uint16_t)(storage[storage_ix >> 3]);
    s->last_bytes_bits_ = storage_ix & 7u;
    UpdateLastProcessedPos(s);
    *output = &storage[0];
    *out_size = storage_ix >> 3;
    return BROTLI_TRUE;
  }
  {
    /* Theoretical max number of commands is 1 per 2 bytes. */
    size_t newsize = s->num_commands_ + bytes / 2 + 1;
    if (newsize > s->cmd_alloc_size_) {
      Command* new_commands;
      /* Reserve a bit more memory to allow merging with a next block
         without reallocation: that would impact speed. */
      newsize += (bytes / 4) + 16;
      s->cmd_alloc_size_ = newsize;
      new_commands = BROTLI_ALLOC(m, Command, newsize);
      if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(new_commands)) return BROTLI_FALSE;
      if (s->commands_) {
        memcpy(new_commands, s->commands_, sizeof(Command) * s->num_commands_);
        BROTLI_FREE(m, s->commands_);
      }
      s->commands_ = new_commands;
    }
  }

  InitOrStitchToPreviousBlock(m, &s->hasher_, data, mask, &s->params,
      wrapped_last_processed_pos, bytes, is_last);

  literal_context_mode = ChooseContextMode(
      &s->params, data, WrapPosition(s->last_flush_pos_),
      mask, (size_t)(s->input_pos_ - s->last_flush_pos_));
  literal_context_lut = BROTLI_CONTEXT_LUT(literal_context_mode);

  if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;

  if (s->num_commands_ && s->last_insert_len_ == 0) {
    ExtendLastCommand(s, &bytes, &wrapped_last_processed_pos);
  }
  if (s->params.quality == ZOPFLIFICATION_QUALITY) {
    BROTLI_DCHECK(s->params.hasher.type == 10);
    BrotliCreateZopfliBackwardReferences(m, bytes, wrapped_last_processed_pos,
        data, mask, literal_context_lut, &s->params,
        &s->hasher_, s->dist_cache_,
        &s->last_insert_len_, &s->commands_[s->num_commands_],
        &s->num_commands_, &s->num_literals_);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
  } else if (s->params.quality == HQ_ZOPFLIFICATION_QUALITY) {
    BROTLI_DCHECK(s->params.hasher.type == 10);
    BrotliCreateHqZopfliBackwardReferences(m, bytes, wrapped_last_processed_pos,
        data, mask, literal_context_lut, &s->params,
        &s->hasher_, s->dist_cache_,
        &s->last_insert_len_, &s->commands_[s->num_commands_],
        &s->num_commands_, &s->num_literals_);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
  } else {
    BrotliCreateBackwardReferences(bytes, wrapped_last_processed_pos,
        data, mask, literal_context_lut, &s->params,
        &s->hasher_, s->dist_cache_,
        &s->last_insert_len_, &s->commands_[s->num_commands_],
        &s->num_commands_, &s->num_literals_, s->backward_references_,
        &s->back_refs_position_, s->back_refs_size_);
  }
  {
    const size_t max_length = MaxMetablockSize(&s->params);
    const size_t max_literals = max_length / 8;
    const size_t max_commands = max_length / 8;
    const size_t processed_bytes = (size_t)(s->input_pos_ - s->last_flush_pos_);
    /* If maximal possible additional block doesn't fit metablock, flush now. */
    /* TODO: Postpone decision until next block arrives? */
    const BROTLI_BOOL next_input_fits_metablock = TO_BROTLI_BOOL(
        processed_bytes + InputBlockSize(s) <= max_length);
    /* If block splitting is not used, then flush as soon as there is some
       amount of commands / literals produced. */
    const BROTLI_BOOL should_flush = TO_BROTLI_BOOL(
        s->params.quality < MIN_QUALITY_FOR_BLOCK_SPLIT &&
        s->num_literals_ + s->num_commands_ >= MAX_NUM_DELAYED_SYMBOLS);
    if (!is_last && !force_flush && !should_flush &&
        next_input_fits_metablock &&
        s->num_literals_ < max_literals &&
        s->num_commands_ < max_commands) {
      /* Merge with next input block. Everything will happen later. */
      if (UpdateLastProcessedPos(s)) {
        HasherReset(&s->hasher_);
      }
      *out_size = 0;
      return BROTLI_TRUE;
    }
  }

  /* Create the last insert-only command. */
  if (s->last_insert_len_ > 0) {
    InitInsertCommand(&s->commands_[s->num_commands_++], s->last_insert_len_);
    s->num_literals_ += s->last_insert_len_;
    s->last_insert_len_ = 0;
  }

  if (!is_last && s->input_pos_ == s->last_flush_pos_) {
    /* We have no new input data and we don't have to finish the stream, so
       nothing to do. */
    *out_size = 0;
    return BROTLI_TRUE;
  }
  BROTLI_DCHECK(s->input_pos_ >= s->last_flush_pos_);
  BROTLI_DCHECK(s->input_pos_ > s->last_flush_pos_ || is_last);
  BROTLI_DCHECK(s->input_pos_ - s->last_flush_pos_ <= 1u << 24);
  {
    const uint32_t metablock_size =
        (uint32_t)(s->input_pos_ - s->last_flush_pos_);
    uint8_t* storage = GetBrotliStorage(s, 2 * metablock_size + 503);
    size_t storage_ix = s->last_bytes_bits_;
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    storage[0] = (uint8_t)s->last_bytes_;
    storage[1] = (uint8_t)(s->last_bytes_ >> 8);
    WriteMetaBlockInternal(
        m, data, mask, s->last_flush_pos_, metablock_size, is_last,
        literal_context_mode, &s->params, s->prev_byte_, s->prev_byte2_,
        s->num_literals_, s->num_commands_, s->commands_, s->saved_dist_cache_,
        s->dist_cache_, &storage_ix, storage, s->literals_block_splits_decoder_,
        &s->current_block_literals_, s->cmds_block_splits_decoder_,
        &s->current_block_cmds_);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    s->last_bytes_ = (uint16_t)(storage[storage_ix >> 3]);
    s->last_bytes_bits_ = storage_ix & 7u;
    s->last_flush_pos_ = s->input_pos_;
    if (UpdateLastProcessedPos(s)) {
      HasherReset(&s->hasher_);
    }
    if (s->last_flush_pos_ > 0) {
      s->prev_byte_ = data[((uint32_t)s->last_flush_pos_ - 1) & mask];
    }
    if (s->last_flush_pos_ > 1) {
      s->prev_byte2_ = data[(uint32_t)(s->last_flush_pos_ - 2) & mask];
    }
    s->num_commands_ = 0;
    s->num_literals_ = 0;
    /* Save the state of the distance cache in case we need to restore it for
       emitting an uncompressed block. */
    memcpy(s->saved_dist_cache_, s->dist_cache_, sizeof(s->saved_dist_cache_));
    *output = &storage[0];
    *out_size = storage_ix >> 3;
    return BROTLI_TRUE;
  }
}